

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Sweep.c
# Opt level: O3

Vec_Ptr_t *
Llb_Nonlin4SweepPartitions(DdManager *dd,Aig_Man_t *pAig,Vec_Int_t *vOrder,int fTransition)

{
  void *pvVar1;
  uint uVar2;
  Vec_Ptr_t *vRoots;
  void **ppvVar3;
  Vec_Ptr_t *pVVar4;
  int iVar5;
  long lVar6;
  
  Aig_ManCleanData(pAig);
  vRoots = (Vec_Ptr_t *)malloc(0x10);
  vRoots->nCap = 100;
  vRoots->nSize = 0;
  ppvVar3 = (void **)malloc(800);
  vRoots->pArray = ppvVar3;
  if (fTransition == 0) {
    if (0 < pAig->nTruePos) {
      lVar6 = 0;
      do {
        if (pAig->vCos->nSize <= lVar6) goto LAB_007e94f7;
        Llb_Nonlin4SweepPartitions_rec(dd,(Aig_Obj_t *)pAig->vCos->pArray[lVar6],vOrder,vRoots);
        lVar6 = lVar6 + 1;
      } while (lVar6 < pAig->nTruePos);
    }
  }
  else if (0 < pAig->nRegs) {
    iVar5 = 0;
    do {
      uVar2 = pAig->nTruePos + iVar5;
      if (((int)uVar2 < 0) || (pAig->vCos->nSize <= (int)uVar2)) {
LAB_007e94f7:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      Llb_Nonlin4SweepPartitions_rec(dd,(Aig_Obj_t *)pAig->vCos->pArray[uVar2],vOrder,vRoots);
      iVar5 = iVar5 + 1;
    } while (iVar5 < pAig->nRegs);
  }
  pVVar4 = pAig->vObjs;
  if (0 < pVVar4->nSize) {
    lVar6 = 0;
    do {
      pvVar1 = pVVar4->pArray[lVar6];
      if (((pvVar1 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar1 + 0x18) & 7) - 7)) &&
         (*(DdNode **)((long)pvVar1 + 0x28) != (DdNode *)0x0)) {
        Cudd_RecursiveDeref(dd,*(DdNode **)((long)pvVar1 + 0x28));
        pVVar4 = pAig->vObjs;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < pVVar4->nSize);
  }
  return vRoots;
}

Assistant:

Vec_Ptr_t * Llb_Nonlin4SweepPartitions( DdManager * dd, Aig_Man_t * pAig, Vec_Int_t * vOrder, int fTransition )
{
    Vec_Ptr_t * vRoots;
    Aig_Obj_t * pObj;
    int i;
    Aig_ManCleanData( pAig );
    vRoots = Vec_PtrAlloc( 100 );
    if ( fTransition )
    {
        Saig_ManForEachLi( pAig, pObj, i )
            Llb_Nonlin4SweepPartitions_rec( dd, pObj, vOrder, vRoots );
    }
    else
    {
        Saig_ManForEachPo( pAig, pObj, i )
            Llb_Nonlin4SweepPartitions_rec( dd, pObj, vOrder, vRoots );
    }
    Aig_ManForEachNode( pAig, pObj, i )
        if ( pObj->pData )
            Cudd_RecursiveDeref( dd, (DdNode *)pObj->pData );
    return vRoots;
}